

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid>::Clone
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *this,TPZGeoMesh *DestMesh)

{
  TPZGeoMesh *pTVar1;
  TPZGeoEl *pTVar2;
  TPZGeoMesh *in_RSI;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *in_RDI;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *unaff_retaddr;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *in_stack_ffffffffffffffd8;
  TPZGeoElRefPattern<pzgeom::TPZQuadraticPyramid> *in_stack_ffffffffffffffe0;
  TPZGeoMesh *in_stack_fffffffffffffff8;
  
  pTVar1 = TPZGeoEl::Mesh((TPZGeoEl *)in_RDI);
  if (in_RSI == pTVar1) {
    pTVar2 = (TPZGeoEl *)operator_new(0x2a0);
    TPZGeoElRefPattern(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    pTVar2 = (TPZGeoEl *)operator_new(0x2a0);
    TPZGeoElRefPattern(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  }
  return pTVar2;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::Clone(TPZGeoMesh &DestMesh) const{
    if(&DestMesh == this->Mesh())
    {
        return new TPZGeoElRefPattern<TGeo>(*this);
    }
    else
    {
        return new TPZGeoElRefPattern<TGeo>(DestMesh, *this);
    }
}